

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv.c
# Opt level: O0

void ConvertRGB24ToY_C(uint8_t *rgb,uint8_t *y,int width)

{
  int iVar1;
  int in_EDX;
  long in_RSI;
  byte *in_RDI;
  int i;
  int local_18;
  byte *local_8;
  
  local_8 = in_RDI;
  for (local_18 = 0; local_18 < in_EDX; local_18 = local_18 + 1) {
    iVar1 = VP8RGBToY((uint)*local_8,(uint)local_8[1],(uint)local_8[2],0x8000);
    *(char *)(in_RSI + local_18) = (char)iVar1;
    local_8 = local_8 + 3;
  }
  return;
}

Assistant:

static void ConvertRGB24ToY_C(const uint8_t* WEBP_RESTRICT rgb,
                              uint8_t* WEBP_RESTRICT y, int width) {
  int i;
  for (i = 0; i < width; ++i, rgb += 3) {
    y[i] = VP8RGBToY(rgb[0], rgb[1], rgb[2], YUV_HALF);
  }
}